

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcShaderLibrary.cpp
# Opt level: O2

void __thiscall deqp::sl::ShaderParser::parseValueBlock(ShaderParser *this,ValueBlock *valueBlock)

{
  int iVar1;
  pointer pVVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  undefined8 extraout_RAX;
  ulong uVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  advanceToken(this,TOKEN_VALUES);
  advanceToken(this,TOKEN_LEFT_BRACE);
  while (this->m_curToken - TOKEN_UNIFORM < 3) {
    parseValue(this,valueBlock);
  }
  if (this->m_curToken == TOKEN_RIGHT_BRACE) {
    advanceToken(this,TOKEN_RIGHT_BRACE);
    pVVar2 = (valueBlock->values).
             super__Vector_base<deqp::sl::ShaderCase::Value,_std::allocator<deqp::sl::ShaderCase::Value>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar4 = ((long)(valueBlock->values).
                   super__Vector_base<deqp::sl::ShaderCase::Value,_std::allocator<deqp::sl::ShaderCase::Value>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar2) / 0x48;
    uVar6 = 0;
    uVar5 = uVar4 & 0xffffffff;
    if ((int)uVar4 < 1) {
      uVar5 = uVar6;
    }
    iVar3 = 1;
    for (; uVar5 * 0x48 - uVar6 != 0; uVar6 = uVar6 + 0x48) {
      iVar1 = *(int *)((long)&pVVar2->arrayLength + uVar6);
      if (1 < iVar1) {
        iVar3 = iVar1;
      }
    }
    valueBlock->arrayLength = iVar3;
    return;
  }
  std::operator+(&local_30,"unexpected token when parsing a value block: ",&this->m_curTokenStr);
  parseError(this,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

void ShaderParser::parseValueBlock(ShaderCase::ValueBlock& valueBlock)
{
	PARSE_DBG(("    parseValueBlock()\n"));
	advanceToken(TOKEN_VALUES);
	advanceToken(TOKEN_LEFT_BRACE);

	for (;;)
	{
		if (m_curToken == TOKEN_UNIFORM || m_curToken == TOKEN_INPUT || m_curToken == TOKEN_OUTPUT)
			parseValue(valueBlock);
		else if (m_curToken == TOKEN_RIGHT_BRACE)
			break;
		else
			parseError(string("unexpected token when parsing a value block: " + m_curTokenStr));
	}

	advanceToken(TOKEN_RIGHT_BRACE);

	// Compute combined array length of value block.
	int arrayLength = 1;
	for (int valueNdx = 0; valueNdx < (int)valueBlock.values.size(); valueNdx++)
	{
		const ShaderCase::Value& val = valueBlock.values[valueNdx];
		if (val.arrayLength > 1)
		{
			DE_ASSERT(arrayLength == 1 || arrayLength == val.arrayLength);
			arrayLength = val.arrayLength;
		}
	}
	valueBlock.arrayLength = arrayLength;
}